

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::
         write_significand<fmt::v8::appender,char,char_const*,fmt::v8::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  char cVar1;
  type tVar2;
  char *pcVar3;
  char *end;
  basic_string_view<char> local_298;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_288;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_280;
  appender local_278 [3];
  allocator<char> local_259;
  undefined1 local_258 [8];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  digit_grouping<char> *grouping_local;
  char decimal_point_local;
  int integral_size_local;
  int significand_size_local;
  char *significand_local;
  appender out_local;
  
  cVar1 = digit_grouping<char>::separator(grouping);
  if (cVar1 == '\0') {
    buffer._528_8_ = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    out_local = write_significand<fmt::v8::appender,char>
                          (out,significand,significand_size,integral_size,decimal_point);
  }
  else {
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_258,&local_259);
    std::allocator<char>::~allocator(&local_259);
    appender::back_insert_iterator(local_278,(buffer<char> *)local_258);
    local_280.container =
         (buffer<char> *)
         write_significand<fmt::v8::appender,char>
                   (local_278[0],significand,significand_size,integral_size,decimal_point);
    local_288 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
    pcVar3 = buffer<char>::data((buffer<char> *)local_258);
    tVar2 = to_unsigned<int>(integral_size);
    basic_string_view<char>::basic_string_view(&local_298,pcVar3,(ulong)tVar2);
    digit_grouping<char>::apply<fmt::v8::appender,char>
              (grouping,(appender)local_288.container,local_298);
    pcVar3 = buffer<char>::data((buffer<char> *)local_258);
    end = buffer<char>::end((buffer<char> *)local_258);
    out_local = copy_str_noinline<char,char*,fmt::v8::appender>(pcVar3 + integral_size,end,out);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_258);
  }
  return (appender)
         out_local.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}